

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformLocationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::getFirstComponentName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,VarType *type)

{
  undefined8 uVar1;
  bool bVar2;
  DataType DVar3;
  SubTypeAccess *pSVar4;
  TypeComponentVector *pTVar5;
  SubTypeAccess local_220;
  TypeAccessFormat local_1f0;
  SubTypeAccess local_1e0;
  TypeAccessFormat local_1b0 [2];
  undefined1 local_190 [8];
  ostringstream buff;
  VarType *type_local;
  
  buff._368_8_ = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  DVar3 = glu::VarType::getBasicType((VarType *)buff._368_8_);
  bVar2 = glu::isDataTypeVector(DVar3);
  uVar1 = buff._368_8_;
  if (bVar2) {
    glu::SubTypeAccess::SubTypeAccess(&local_1e0,(VarType *)buff._368_8_);
    pSVar4 = glu::SubTypeAccess::component(&local_1e0,0);
    pTVar5 = glu::SubTypeAccess::getPath(pSVar4);
    glu::TypeAccessFormat::TypeAccessFormat(local_1b0,(VarType *)uVar1,pTVar5);
    glu::operator<<((ostream *)local_190,local_1b0);
    glu::SubTypeAccess::~SubTypeAccess(&local_1e0);
  }
  else {
    DVar3 = glu::VarType::getBasicType((VarType *)buff._368_8_);
    bVar2 = glu::isDataTypeMatrix(DVar3);
    uVar1 = buff._368_8_;
    if (bVar2) {
      glu::SubTypeAccess::SubTypeAccess(&local_220,(VarType *)buff._368_8_);
      pSVar4 = glu::SubTypeAccess::column(&local_220,0);
      pSVar4 = glu::SubTypeAccess::component(pSVar4,0);
      pTVar5 = glu::SubTypeAccess::getPath(pSVar4);
      glu::TypeAccessFormat::TypeAccessFormat(&local_1f0,(VarType *)uVar1,pTVar5);
      glu::operator<<((ostream *)local_190,&local_1f0);
      glu::SubTypeAccess::~SubTypeAccess(&local_220);
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

string getFirstComponentName (const glu::VarType& type)
{
	std::ostringstream buff;
	if (glu::isDataTypeVector(type.getBasicType()))
		buff << glu::TypeAccessFormat(type, glu::SubTypeAccess(type).component(0).getPath());
	else if (glu::isDataTypeMatrix(type.getBasicType()))
		buff << glu::TypeAccessFormat(type, glu::SubTypeAccess(type).column(0).component(0).getPath());

	return buff.str();
}